

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

void __thiscall
google::protobuf::DynamicMessageFactory::~DynamicMessageFactory(DynamicMessageFactory *this)

{
  scoped_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap> *this_00;
  TypeInfo *this_01;
  PrototypeMap *pPVar1;
  void *default_oneof_instance;
  uint32 *in_RSI;
  __node_base *p_Var2;
  
  (this->super_MessageFactory)._vptr_MessageFactory =
       (_func_int **)&PTR__DynamicMessageFactory_00773670;
  this_00 = &this->prototypes_;
  pPVar1 = internal::scoped_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap>::operator->
                     (this_00);
  p_Var2 = &(pPVar1->map_).
            super_unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessage::TypeInfo_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>_>
            ._M_h._M_before_begin;
  while( true ) {
    p_Var2 = p_Var2->_M_nxt;
    internal::scoped_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap>::operator->(this_00)
    ;
    if (p_Var2 == (__node_base *)0x0) break;
    DeleteDefaultOneofInstance
              ((Descriptor *)
               (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor)[5]
               ._M_nxt,in_RSI,default_oneof_instance);
    this_01 = *(TypeInfo **)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor;
    if (this_01 != (TypeInfo *)0x0) {
      DynamicMessage::TypeInfo::~TypeInfo(this_01);
    }
    in_RSI = (uint32 *)0x58;
    operator_delete(this_01,0x58);
  }
  internal::Mutex::~Mutex(&this->prototypes_mutex_);
  internal::scoped_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap>::~scoped_ptr(this_00);
  MessageFactory::~MessageFactory(&this->super_MessageFactory);
  return;
}

Assistant:

DynamicMessageFactory::~DynamicMessageFactory() {
  for (PrototypeMap::Map::iterator iter = prototypes_->map_.begin();
       iter != prototypes_->map_.end(); ++iter) {
    DeleteDefaultOneofInstance(iter->second->type,
                               iter->second->offsets.get(),
                               iter->second->prototype);
    delete iter->second;
  }
}